

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroupStamp.hpp
# Opt level: O2

void __thiscall OpenMD::CutoffGroupStamp::~CutoffGroupStamp(CutoffGroupStamp *this)

{
  ~CutoffGroupStamp(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

int getMemberAt(int index) { return members_[index]; }